

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbedTexturesProcess.cpp
# Opt level: O2

bool __thiscall
Assimp::EmbedTexturesProcess::addTexture(EmbedTexturesProcess *this,aiScene *pScene,string *path)

{
  uint uVar1;
  aiTexture **__src;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  Logger *pLVar7;
  aiTexel *paVar8;
  aiTexture **__dest;
  aiTexture *paVar9;
  size_t __n;
  size_type sVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  aiScene *local_3d8;
  string imagePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> extension;
  ifstream file;
  
  std::__cxx11::string::string((string *)&imagePath,(string *)path);
  std::ifstream::ifstream(&file,(string *)&imagePath,_S_bin|_S_ate);
  uVar6 = std::istream::tellg();
  if (uVar6 == 0xffffffffffffffff) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[42]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&extension,
               (char (*) [42])"EmbedTexturesProcess: Cannot find image: ");
    std::operator<<((ostream *)&extension,(string *)&imagePath);
    std::operator<<((ostream *)&extension,". Will try to find it in root folder.");
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar7,local_3f8._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extension);
    std::operator+(&extension,&this->mRootPath,path);
    std::__cxx11::string::operator=((string *)&imagePath,(string *)&extension);
    std::__cxx11::string::~string((string *)&extension);
    std::ifstream::open((string *)&file,(_Ios_Openmode)&imagePath);
    uVar6 = std::istream::tellg();
    if (uVar6 == 0xffffffffffffffff) {
      std::__cxx11::string::find_last_of((char *)path,0x5ca97d);
      std::__cxx11::string::substr((ulong)&local_3f8,(ulong)path);
      std::operator+(&extension,&this->mRootPath,&local_3f8);
      std::__cxx11::string::operator=((string *)&imagePath,(string *)&extension);
      std::__cxx11::string::~string((string *)&extension);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::ifstream::open((string *)&file,(_Ios_Openmode)&imagePath);
      uVar6 = std::istream::tellg();
      if (uVar6 == 0xffffffffffffffff) {
        pLVar7 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[48]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &extension,(char (*) [48])"EmbedTexturesProcess: Unable to embed texture: ");
        std::operator<<((ostream *)&extension,(string *)path);
        std::operator<<((ostream *)&extension,".");
        std::__cxx11::stringbuf::str();
        Logger::error(pLVar7,local_3f8._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extension);
        bVar4 = false;
        goto LAB_003b3b64;
      }
    }
  }
  uVar11 = 0xffffffffffffffff;
  if (uVar6 < 0xfffffffffffffffc) {
    uVar11 = (uVar6 & 0xfffffffffffffffc) + 4;
  }
  paVar8 = (aiTexel *)operator_new__(uVar11);
  std::istream::seekg((long)&file,_S_beg);
  std::istream::read((char *)&file,(long)paVar8);
  uVar1 = pScene->mNumTextures;
  pScene->mNumTextures = uVar1 + 1;
  __src = pScene->mTextures;
  __dest = (aiTexture **)operator_new__((ulong)(uVar1 + 1) << 3);
  pScene->mTextures = __dest;
  memmove(__dest,__src,(ulong)uVar1 * 8);
  paVar9 = (aiTexture *)operator_new(0x428);
  (paVar9->mFilename).length = 0;
  (paVar9->mFilename).data[0] = '\0';
  local_3d8 = pScene;
  memset((paVar9->mFilename).data + 1,0x1b,0x3ff);
  paVar9->mHeight = 0;
  paVar9->achFormatHint[0] = '\0';
  paVar9->achFormatHint[1] = '\0';
  paVar9->achFormatHint[2] = '\0';
  paVar9->achFormatHint[3] = '\0';
  paVar9->mWidth = (uint)uVar6;
  paVar9->pcData = paVar8;
  std::__cxx11::string::rfind((char)path,0x2e);
  std::__cxx11::string::substr((ulong)&extension,(ulong)path);
  sVar3 = extension._M_string_length;
  _Var2 = extension._M_dataplus;
  for (sVar10 = 0; sVar3 != sVar10; sVar10 = sVar10 + 1) {
    iVar5 = tolower((int)_Var2._M_p[sVar10]);
    _Var2._M_p[sVar10] = (char)iVar5;
  }
  bVar4 = std::operator==(&extension,"jpeg");
  if (bVar4) {
    std::__cxx11::string::assign((char *)&extension);
  }
  __n = 8;
  if (extension._M_string_length < 8) {
    __n = extension._M_string_length;
  }
  strncpy(paVar9->achFormatHint,extension._M_dataplus._M_p,__n);
  local_3d8->mTextures[uVar1] = paVar9;
  std::__cxx11::string::~string((string *)&extension);
  bVar4 = true;
LAB_003b3b64:
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::~string((string *)&imagePath);
  return bVar4;
}

Assistant:

bool EmbedTexturesProcess::addTexture(aiScene* pScene, std::string path) const {
    std::streampos imageSize = 0;
    std::string    imagePath = path;

    // Test path directly
    std::ifstream file(imagePath, std::ios::binary | std::ios::ate);
    if ((imageSize = file.tellg()) == std::streampos(-1)) {
        ASSIMP_LOG_WARN_F("EmbedTexturesProcess: Cannot find image: ", imagePath, ". Will try to find it in root folder.");

        // Test path in root path
        imagePath = mRootPath + path;
        file.open(imagePath, std::ios::binary | std::ios::ate);
        if ((imageSize = file.tellg()) == std::streampos(-1)) {
            // Test path basename in root path
            imagePath = mRootPath + path.substr(path.find_last_of("\\/") + 1u);
            file.open(imagePath, std::ios::binary | std::ios::ate);
            if ((imageSize = file.tellg()) == std::streampos(-1)) {
                ASSIMP_LOG_ERROR_F("EmbedTexturesProcess: Unable to embed texture: ", path, ".");
                return false;
            }
        }
    }

    aiTexel* imageContent = new aiTexel[ 1ul + static_cast<unsigned long>( imageSize ) / sizeof(aiTexel)];
    file.seekg(0, std::ios::beg);
    file.read(reinterpret_cast<char*>(imageContent), imageSize);

    // Enlarging the textures table
    unsigned int textureId = pScene->mNumTextures++;
    auto oldTextures = pScene->mTextures;
    pScene->mTextures = new aiTexture*[pScene->mNumTextures];
    ::memmove(pScene->mTextures, oldTextures, sizeof(aiTexture*) * (pScene->mNumTextures - 1u));

    // Add the new texture
    auto pTexture = new aiTexture;
    pTexture->mHeight = 0; // Means that this is still compressed
    pTexture->mWidth = static_cast<uint32_t>(imageSize);
    pTexture->pcData = imageContent;

    auto extension = path.substr(path.find_last_of('.') + 1u);
    std::transform(extension.begin(), extension.end(), extension.begin(), ::tolower);
    if (extension == "jpeg") {
        extension = "jpg";
    }

    size_t len = extension.size();
    if (len > HINTMAXTEXTURELEN -1 ) {
        len = HINTMAXTEXTURELEN - 1;
    }
    ::strncpy(pTexture->achFormatHint, extension.c_str(), len);
    pScene->mTextures[textureId] = pTexture;

    return true;
}